

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadCodeMetadataSection
          (BinaryReader *this,string_view name,Offset section_size)

{
  uint uVar1;
  int iVar2;
  Result RVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  Index function_index;
  Address data_size;
  Index num_metadata;
  Index num_functions;
  void *data;
  uint local_54;
  undefined8 local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  void *local_38;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd7])
                    (this->delegate_,name._M_len,name._M_str);
  if (iVar2 == 0) {
    RVar3 = ReadCount(this,&local_3c,"function count");
    if (RVar3.enum_ != Error) {
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd8])(this->delegate_,(ulong)local_3c);
      if (iVar2 == 0) {
        if (local_3c != 0) {
          uVar8 = 0;
          local_48 = local_3c;
          uVar7 = 0xffffffff;
          do {
            RVar3 = ReadCount(this,&local_54,"function index");
            uVar1 = local_54;
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            if (local_54 < this->num_func_imports_) {
              pcVar6 = "function import can\'t have metadata (got %u)";
LAB_001552b9:
              PrintError(this,pcVar6,(ulong)local_54);
              return (Result)Error;
            }
            if (this->num_func_imports_ + this->num_function_signatures_ <= local_54) {
              pcVar6 = "invalid function index: %u";
              goto LAB_001552b9;
            }
            if (local_54 == uVar7) {
              pcVar6 = "duplicate function index: %u";
              local_54 = uVar7;
              goto LAB_001552b9;
            }
            if (local_54 <= uVar7 && uVar7 != 0xffffffff) {
              pcVar6 = "function index out of order: %u";
              goto LAB_001552b9;
            }
            RVar3 = ReadCount(this,&local_40,"metadata instances count");
            uVar7 = local_40;
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd9])
                              (this->delegate_,(ulong)uVar1,(ulong)local_40);
            if (iVar2 != 0) {
              pcVar6 = "OnCodeMetadataCount callback failed";
              goto LAB_001550a6;
            }
            local_44 = uVar8;
            if (uVar7 != 0) {
              uVar4 = 0xffffffffffffffff;
              do {
                RVar3 = ReadU32Leb128(this,(uint32_t *)&local_50,"code offset");
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
                uVar5 = (ulong)(uint)local_50;
                if (uVar4 == uVar5) {
                  pcVar6 = "duplicate code offset: %zx";
LAB_00155273:
                  PrintError(this,pcVar6,uVar4);
                  return (Result)Error;
                }
                if (uVar5 <= uVar4 && uVar4 != 0xffffffffffffffff) {
                  pcVar6 = "code offset out of order: %zx";
                  uVar4 = uVar5;
                  goto LAB_00155273;
                }
                RVar3 = ReadBytes(this,&local_38,&local_50,"instance data");
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
                iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xda])
                                  (this->delegate_,uVar5,local_38,
                                   CONCAT44(local_50._4_4_,(uint)local_50));
                if (iVar2 != 0) {
                  pcVar6 = "OnCodeMetadata callback failed";
                  goto LAB_001550a6;
                }
                uVar7 = uVar7 - 1;
                uVar4 = uVar5;
              } while (uVar7 != 0);
            }
            uVar8 = local_44 + 1;
            uVar7 = uVar1;
          } while (uVar8 != local_48);
        }
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xdb])();
        if (iVar2 == 0) {
          return (Result)Ok;
        }
        pcVar6 = "EndCodeMetadataSection callback failed";
      }
      else {
        pcVar6 = "OnCodeMetadataFuncCount callback failed";
      }
LAB_001550a6:
      PrintError(this,pcVar6);
    }
  }
  else {
    PrintError(this,"BeginCodeMetadataSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadCodeMetadataSection(std::string_view name,
                                             Offset section_size) {
  CALLBACK(BeginCodeMetadataSection, name, section_size);

  Index num_functions;
  CHECK_RESULT(ReadCount(&num_functions, "function count"));
  CALLBACK(OnCodeMetadataFuncCount, num_functions);

  Index last_function_index = kInvalidIndex;
  for (Index i = 0; i < num_functions; ++i) {
    Index function_index;
    CHECK_RESULT(ReadCount(&function_index, "function index"));
    ERROR_UNLESS(function_index >= num_func_imports_,
                 "function import can't have metadata (got %" PRIindex ")",
                 function_index);
    ERROR_UNLESS(function_index < NumTotalFuncs(),
                 "invalid function index: %" PRIindex, function_index);
    ERROR_UNLESS(function_index != last_function_index,
                 "duplicate function index: %" PRIindex, function_index);
    ERROR_UNLESS(last_function_index == kInvalidIndex ||
                     function_index > last_function_index,
                 "function index out of order: %" PRIindex, function_index);
    last_function_index = function_index;

    Index num_metadata;
    CHECK_RESULT(ReadCount(&num_metadata, "metadata instances count"));

    CALLBACK(OnCodeMetadataCount, function_index, num_metadata);

    Offset last_code_offset = kInvalidOffset;
    for (Index j = 0; j < num_metadata; ++j) {
      Offset code_offset;
      CHECK_RESULT(ReadOffset(&code_offset, "code offset"));
      ERROR_UNLESS(code_offset != last_code_offset,
                   "duplicate code offset: %" PRIzx, code_offset);
      ERROR_UNLESS(
          last_code_offset == kInvalidOffset || code_offset > last_code_offset,
          "code offset out of order: %" PRIzx, code_offset);
      last_code_offset = code_offset;

      Address data_size;
      const void* data;
      CHECK_RESULT(ReadBytes(&data, &data_size, "instance data"));
      CALLBACK(OnCodeMetadata, code_offset, data, data_size);
    }
  }

  CALLBACK(EndCodeMetadataSection);
  return Result::Ok;
}